

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.cpp
# Opt level: O0

error arc::read_list(char *start,char **end,atom *result)

{
  bool bVar1;
  atom *paVar2;
  atom local_c8;
  atom local_a8;
  int local_88;
  error local_84;
  undefined1 local_80 [4];
  error err;
  atom item;
  char *token;
  undefined1 local_48 [8];
  atom p;
  atom *result_local;
  char **end_local;
  char *start_local;
  
  p.val.
  super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
  .
  super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
  .
  super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
  .
  super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
  .
  super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
  .
  super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
  ._16_8_ = result;
  atom::atom((atom *)local_48);
  *end = start;
  paVar2 = atom::operator=((atom *)p.val.
                                   super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                                   .
                                   super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                                   .
                                   super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                                   .
                                   super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                                   .
                                   super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                                   .
                                   super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                                   ._16_8_,(atom *)nil);
  atom::operator=((atom *)local_48,paVar2);
  do {
    atom::atom((atom *)local_80);
    local_84 = lex(*end,(char **)((long)&item.val.
                                         super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                                         .
                                         super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                                         .
                                         super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                                         .
                                         super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                                         .
                                         super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                                 + 0x10),end);
    if (local_84 == ERROR_OK) {
      if (*(char *)item.val.
                   super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                   .
                   super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                   .
                   super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                   .
                   super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                   .
                   super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                   .
                   super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                   ._16_8_ == ')') {
        start_local._4_4_ = ERROR_OK;
        local_88 = 1;
      }
      else {
        bVar1 = no((atom *)local_48);
        if (((bVar1) ||
            (*(char *)item.val.
                      super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                      .
                      super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                      .
                      super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                      .
                      super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                      .
                      super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                      .
                      super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                      ._16_8_ != '.')) ||
           ((long)*end -
            item.val.
            super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
            .
            super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
            .
            super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
            .
            super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
            .
            super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
            .
            super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
            ._16_8_ != 1)) {
          local_84 = read_expr((char *)item.val.
                                       super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                                       .
                                       super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                                       .
                                       super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                                       .
                                       super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                                       .
                                       super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                                       .
                                       super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                                       ._16_8_,end,(atom *)local_80);
          if (local_84 == ERROR_OK) {
            bVar1 = no((atom *)local_48);
            if (bVar1) {
              make_cons(&local_a8,(atom *)local_80,(atom *)nil);
              atom::operator=((atom *)p.val.
                                      super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                                      .
                                      super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                                      .
                                      super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                                      .
                                      super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                                      .
                                      super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                                      .
                                      super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                                      ._16_8_,&local_a8);
              atom::~atom(&local_a8);
              atom::operator=((atom *)local_48,
                              (atom *)p.val.
                                      super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                                      .
                                      super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                                      .
                                      super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                                      .
                                      super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                                      .
                                      super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                                      .
                                      super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                                      ._16_8_);
            }
            else {
              make_cons(&local_c8,(atom *)local_80,(atom *)nil);
              paVar2 = cdr((atom *)local_48);
              atom::operator=(paVar2,&local_c8);
              atom::~atom(&local_c8);
              paVar2 = cdr((atom *)local_48);
              atom::operator=((atom *)local_48,paVar2);
            }
            local_88 = 0;
          }
          else {
            local_88 = 1;
            start_local._4_4_ = local_84;
          }
        }
        else {
          bVar1 = no((atom *)local_48);
          if (bVar1) {
            start_local._4_4_ = ERROR_SYNTAX;
            local_88 = 1;
          }
          else {
            local_84 = read_expr(*end,end,(atom *)local_80);
            if (local_84 == ERROR_OK) {
              paVar2 = cdr((atom *)local_48);
              atom::operator=(paVar2,(atom *)local_80);
              local_84 = lex(*end,(char **)((long)&item.val.
                                                  super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                                           + 0x10),end);
              if ((local_84 == ERROR_OK) &&
                 (*(char *)item.val.
                           super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                           .
                           super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                           .
                           super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                           .
                           super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                           .
                           super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                           .
                           super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                           ._16_8_ != ')')) {
                local_84 = ERROR_SYNTAX;
              }
              start_local._4_4_ = local_84;
              local_88 = 1;
            }
            else {
              local_88 = 1;
              start_local._4_4_ = local_84;
            }
          }
        }
      }
    }
    else {
      local_88 = 1;
      start_local._4_4_ = local_84;
    }
    atom::~atom((atom *)local_80);
  } while (local_88 == 0);
  atom::~atom((atom *)local_48);
  return start_local._4_4_;
}

Assistant:

error read_list(const char* start, const char** end, atom* result)
	{
		atom p;

		*end = start;
		p = *result = nil;

		for (;;) {
			const char* token;
			atom item;
			error err;

			err = lex(*end, &token, end);
			if (err)
				return err;

			if (token[0] == ')') {
				return ERROR_OK;
			}

			if (!no(p) && token[0] == '.' && *end - token == 1) {
				/* Improper list */
				if (no(p)) return ERROR_SYNTAX;

				err = read_expr(*end, end, &item);
				if (err) return err;

				cdr(p) = item;

				/* Read the closing ')' */
				err = lex(*end, &token, end);
				if (!err && token[0] != ')') {
					err = ERROR_SYNTAX;
				}
				return err;
			}

			err = read_expr(token, end, &item);
			if (err)
				return err;

			if (no(p)) {
				/* First item */
				*result = make_cons(item, nil);
				p = *result;
			}
			else {
				cdr(p) = make_cons(item, nil);
				p = cdr(p);
			}
		}
	}